

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O0

string * __thiscall
flatbuffers::java::GenMethod_abi_cxx11_(string *__return_storage_ptr__,java *this,FieldDef *field)

{
  bool bVar1;
  bool bVar2;
  Type *type;
  char *local_70;
  allocator local_4d [20];
  byte local_39;
  string local_38;
  java *local_18;
  FieldDef *field_local;
  
  local_18 = this;
  field_local = (FieldDef *)__return_storage_ptr__;
  bVar1 = IsScalar(*(BaseType *)(this + 0x90));
  local_39 = 0;
  bVar2 = false;
  if (bVar1) {
    GenTypeBasic_abi_cxx11_(&local_38,local_18 + 0x90,type);
    local_39 = 1;
    MakeCamel(__return_storage_ptr__,&local_38,true);
  }
  else {
    bVar2 = IsStruct((Type *)(local_18 + 0x90));
    if (bVar2) {
      local_70 = "Struct";
    }
    else {
      local_70 = "Offset";
    }
    std::allocator<char>::allocator();
    bVar2 = true;
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_70,local_4d);
  }
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)local_4d);
  }
  if ((local_39 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GenMethod(const FieldDef &field) {
  return IsScalar(field.value.type.base_type)
    ? MakeCamel(GenTypeBasic(field.value.type))
    : (IsStruct(field.value.type) ? "Struct" : "Offset");
}